

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

void Acec_TreeFilterOne2(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  uint *puVar1;
  size_t __n;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  byte bVar6;
  void *__s;
  Vec_Bit_t *vMarked;
  int *piVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  
  iVar8 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  iVar11 = iVar8 * 0x20;
  if (iVar8 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar8 * 4);
  }
  __n = (long)iVar8 * 4;
  memset(__s,0,__n);
  vMarked = (Vec_Bit_t *)malloc(0x10);
  vMarked->nSize = 0;
  vMarked->nCap = iVar11;
  if (iVar8 == 0) {
    piVar7 = (int *)0x0;
  }
  else {
    piVar7 = (int *)malloc(__n);
  }
  vMarked->pArray = piVar7;
  vMarked->nSize = iVar11;
  memset(piVar7,0,__n);
  iVar8 = vTree->nSize;
  if (1 < iVar8) {
    piVar7 = vTree->pArray;
    lVar14 = 0;
    do {
      iVar2 = piVar7[lVar14];
      if (iVar2 < 0) goto LAB_0067c777;
      uVar4 = iVar2 * 6;
      uVar9 = vAdds->nSize;
      if (uVar9 == uVar4 || SBORROW4(uVar9,uVar4) != (int)(uVar9 + iVar2 * -6) < 0)
      goto LAB_0067c777;
      piVar5 = vAdds->pArray;
      uVar10 = piVar5[uVar4];
      if (((int)uVar10 < 0) || (iVar11 <= (int)uVar10)) goto LAB_0067c796;
      puVar1 = (uint *)((long)__s + (ulong)(uVar10 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar10 & 0x1f);
      if ((int)uVar9 <= (int)(uVar4 | 1)) goto LAB_0067c777;
      uVar10 = piVar5[uVar4 | 1];
      if (((int)uVar10 < 0) || (iVar11 <= (int)uVar10)) goto LAB_0067c796;
      puVar1 = (uint *)((long)__s + (ulong)(uVar10 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar10 & 0x1f);
      if ((int)uVar9 <= (int)(uVar4 + 2)) goto LAB_0067c777;
      uVar9 = piVar5[uVar4 + 2];
      if (((int)uVar9 < 0) || (iVar11 <= (int)uVar9)) goto LAB_0067c796;
      puVar1 = (uint *)((long)__s + (ulong)(uVar9 >> 5) * 4);
      *puVar1 = *puVar1 | 1 << ((byte)uVar9 & 0x1f);
      iVar2 = (int)lVar14;
      lVar14 = lVar14 + 2;
    } while (iVar2 + 3 < iVar8);
  }
  iVar8 = vTree->nSize;
  if (1 < iVar8) {
    piVar7 = vTree->pArray;
    lVar14 = 0;
    do {
      iVar2 = piVar7[lVar14];
      if (iVar2 < 0) goto LAB_0067c777;
      uVar9 = iVar2 * 6 + 3;
      iVar3 = vAdds->nSize;
      if (iVar3 <= (int)uVar9) goto LAB_0067c777;
      piVar5 = vAdds->pArray;
      uVar9 = piVar5[uVar9];
      if (((int)uVar9 < 0) || (iVar11 <= (int)uVar9)) {
LAB_0067c796:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      bVar6 = (byte)uVar9 & 0x1f;
      puVar1 = (uint *)((long)__s + (ulong)(uVar9 >> 5) * 4);
      *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      uVar9 = iVar2 * 6 + 4;
      if (iVar3 <= (int)uVar9) goto LAB_0067c777;
      uVar9 = piVar5[uVar9];
      if (((int)uVar9 < 0) || (iVar11 <= (int)uVar9)) goto LAB_0067c796;
      bVar6 = (byte)uVar9 & 0x1f;
      puVar1 = (uint *)((long)__s + (ulong)(uVar9 >> 5) * 4);
      *puVar1 = *puVar1 & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
      iVar2 = (int)lVar14;
      lVar14 = lVar14 + 2;
    } while (iVar2 + 3 < iVar8);
  }
  if (0 < p->nObjs) {
    lVar14 = 0;
    uVar12 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar9 = *(uint *)(&p->pObjs->field_0x0 + lVar14);
      if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
        if ((long)iVar11 <= (long)uVar12) goto LAB_0067c7b5;
        if ((*(uint *)((long)__s + (uVar12 >> 5 & 0x7ffffff) * 4) >> ((uint)uVar12 & 0x1f) & 1) != 0
           ) {
          Acec_TreeMarkTFI_rec(p,(uint)uVar12,vMarked);
        }
      }
      uVar12 = uVar12 + 1;
      lVar14 = lVar14 + 0xc;
    } while ((long)uVar12 < (long)p->nObjs);
  }
  iVar8 = vTree->nSize;
  uVar9 = 0;
  if (1 < iVar8) {
    lVar14 = 1;
    uVar9 = 0;
    do {
      piVar7 = vTree->pArray;
      uVar4 = piVar7[lVar14 + -1];
      if ((int)uVar4 < 0) {
LAB_0067c777:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar10 = uVar4 * 6 + 3;
      iVar11 = vAdds->nSize;
      if (iVar11 <= (int)uVar10) goto LAB_0067c777;
      piVar5 = vAdds->pArray;
      uVar10 = piVar5[uVar10];
      if (((int)uVar10 < 0) || (vMarked->nSize <= (int)uVar10)) goto LAB_0067c7b5;
      iVar2 = piVar7[lVar14];
      if (((uint)vMarked->pArray[uVar10 >> 5] >> (uVar10 & 0x1f) & 1) == 0) {
        uVar13 = uVar4 * 6 + 4;
        if (iVar11 <= (int)uVar13) goto LAB_0067c777;
        uVar13 = piVar5[uVar13];
        if (((int)uVar13 < 0) || (vMarked->nSize <= (int)uVar13)) {
LAB_0067c7b5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        if (((uint)vMarked->pArray[uVar13 >> 5] >> (uVar13 & 0x1f) & 1) != 0) goto LAB_0067c6b5;
        if (((int)uVar9 < 0) || (iVar8 <= (int)uVar9)) {
LAB_0067c7d4:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        uVar10 = uVar9 + 1;
        piVar7[uVar9] = uVar4;
        if (vTree->nSize <= (int)uVar10) goto LAB_0067c7d4;
        uVar9 = uVar9 + 2;
        piVar7[uVar10] = iVar2;
      }
      else {
LAB_0067c6b5:
        uVar13 = uVar4 * 6 + 4;
        if (iVar11 <= (int)uVar13) goto LAB_0067c777;
        printf("Removing box %d=(%d,%d) of rank %d.\n",(ulong)uVar4,(ulong)uVar10,
               (ulong)(uint)piVar5[uVar13]);
      }
      iVar8 = vTree->nSize;
      lVar14 = lVar14 + 2;
    } while ((int)lVar14 < iVar8);
  }
  if (iVar8 < (int)uVar9) {
    __assert_fail("p->nSize >= nSizeNew",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
  }
  vTree->nSize = uVar9;
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (vMarked->pArray != (int *)0x0) {
    free(vMarked->pArray);
    vMarked->pArray = (int *)0x0;
  }
  free(vMarked);
  return;
}

Assistant:

void Acec_TreeFilterOne2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vMarked = Vec_BitStart( Gia_ManObjNum(p) ) ;
    Gia_Obj_t * pObj;
    int i, k = 0, Box, Rank;
    // mark leaves
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
    }
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+3), 0 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4), 0 );
    }
    // mark TFI of leaves
    Gia_ManForEachAnd( p, pObj, i )
        if ( Vec_BitEntry(vIsLeaf, i) )
            Acec_TreeMarkTFI_rec( p, i, vMarked );
    // additional one
//if ( 10942 < Gia_ManObjNum(p) )
//    Acec_TreeMarkTFI_rec( p, 10942, vMarked );
    // remove those that overlap with the marked TFI
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
        if ( Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+3)) || Vec_BitEntry(vMarked, Vec_IntEntry(vAdds, 6*Box+4)) )
        {
            printf( "Removing box %d=(%d,%d) of rank %d.\n", Box, Vec_IntEntry(vAdds, 6*Box+3), Vec_IntEntry(vAdds, 6*Box+4), Rank ); 
            continue;
        }
        Vec_IntWriteEntry( vTree, k++, Box );
        Vec_IntWriteEntry( vTree, k++, Rank );
    }
    Vec_IntShrink( vTree, k );
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vMarked );
}